

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFPageObjectHelper::placeFormXObject
          (string *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          string *name,Rectangle rect,bool invert_transformations,bool allow_shrink,
          bool allow_expand)

{
  QPDFMatrix cm;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  QPDFMatrix local_60;
  
  QPDFMatrix::QPDFMatrix(&local_60);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)fo);
  placeFormXObject(__return_storage_ptr__,this,(QPDFObjectHandle *)&local_70,name,rect,&local_60,
                   invert_transformations,allow_shrink,allow_expand);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFPageObjectHelper::placeFormXObject(
    QPDFObjectHandle fo,
    std::string const& name,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    QPDFMatrix cm;
    return placeFormXObject(fo, name, rect, cm, invert_transformations, allow_shrink, allow_expand);
}